

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_scopes.cpp
# Opt level: O0

bool spvtools::val::IsValidScope(uint32_t scope)

{
  uint32_t scope_local;
  
  return scope < 7;
}

Assistant:

bool IsValidScope(uint32_t scope) {
  // Deliberately avoid a default case so we have to update the list when the
  // scopes list changes.
  switch (static_cast<spv::Scope>(scope)) {
    case spv::Scope::CrossDevice:
    case spv::Scope::Device:
    case spv::Scope::Workgroup:
    case spv::Scope::Subgroup:
    case spv::Scope::Invocation:
    case spv::Scope::QueueFamilyKHR:
    case spv::Scope::ShaderCallKHR:
      return true;
    case spv::Scope::Max:
      break;
  }
  return false;
}